

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_audio_buffer_alloc_and_init
                    (ma_audio_buffer_config *pConfig,ma_audio_buffer **ppAudioBuffer)

{
  undefined1 *__src;
  ma_result mVar1;
  ma_audio_buffer *pAudioBuffer;
  size_t __n;
  int __c;
  ma_uint8 *__s;
  ma_audio_buffer_config innerConfig;
  ma_audio_buffer_config local_78;
  
  if (ppAudioBuffer == (ma_audio_buffer **)0x0) {
    return MA_INVALID_ARGS;
  }
  *ppAudioBuffer = (ma_audio_buffer *)0x0;
  if (pConfig == (ma_audio_buffer_config *)0x0) {
    return MA_INVALID_ARGS;
  }
  local_78.format = pConfig->format;
  local_78.channels = pConfig->channels;
  local_78.sampleRate = pConfig->sampleRate;
  local_78._12_4_ = *(undefined4 *)&pConfig->field_0xc;
  local_78.sizeInFrames = pConfig->sizeInFrames;
  local_78.pData = pConfig->pData;
  local_78.allocationCallbacks.pUserData = (pConfig->allocationCallbacks).pUserData;
  local_78.allocationCallbacks.onMalloc = (pConfig->allocationCallbacks).onMalloc;
  local_78.allocationCallbacks.onRealloc = (pConfig->allocationCallbacks).onRealloc;
  local_78.allocationCallbacks.onFree = (pConfig->allocationCallbacks).onFree;
  ma_allocation_callbacks_init_copy(&local_78.allocationCallbacks,&pConfig->allocationCallbacks);
  if (local_78.allocationCallbacks.onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
    return MA_OUT_OF_MEMORY;
  }
  pAudioBuffer = (ma_audio_buffer *)
                 (*local_78.allocationCallbacks.onMalloc)
                           ((ulong)(pConfig->channels *
                                   *(int *)(&DAT_0019a900 + (ulong)pConfig->format * 4)) *
                            pConfig->sizeInFrames + 0x97,local_78.allocationCallbacks.pUserData);
  if (pAudioBuffer == (ma_audio_buffer *)0x0) {
    return MA_OUT_OF_MEMORY;
  }
  __src = (undefined1 *)pConfig->pData;
  __s = pAudioBuffer->_pExtraData;
  if (__src == (undefined1 *)0x0) {
    if ((ulong)pConfig->format == 1) {
      __n = pConfig->sizeInFrames * (ulong)pConfig->channels;
      if (__n == 0) goto LAB_001669f2;
      __c = 0x80;
    }
    else {
      __n = pConfig->sizeInFrames *
            (ulong)(pConfig->channels * *(int *)(&DAT_0019a900 + (ulong)pConfig->format * 4));
      if (__n == 0) goto LAB_001669f2;
      __c = 0;
    }
    memset(__s,__c,__n);
  }
  else if (__s != __src) {
    memcpy(__s,__src,
           (ulong)(*(int *)(&DAT_0019a900 + (ulong)pConfig->format * 4) * pConfig->channels) *
           pConfig->sizeInFrames);
  }
LAB_001669f2:
  local_78.pData = __s;
  mVar1 = ma_audio_buffer_init_ex(&local_78,0,pAudioBuffer);
  if (mVar1 == MA_SUCCESS) {
    *ppAudioBuffer = pAudioBuffer;
    mVar1 = MA_SUCCESS;
  }
  else if (local_78.allocationCallbacks.onFree != (_func_void_void_ptr_void_ptr *)0x0) {
    (*local_78.allocationCallbacks.onFree)(pAudioBuffer,local_78.allocationCallbacks.pUserData);
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_audio_buffer_alloc_and_init(const ma_audio_buffer_config* pConfig, ma_audio_buffer** ppAudioBuffer)
{
    ma_result result;
    ma_audio_buffer* pAudioBuffer;
    ma_audio_buffer_config innerConfig; /* We'll be making some changes to the config, so need to make a copy. */
    ma_uint64 allocationSizeInBytes;

    if (ppAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    *ppAudioBuffer = NULL;  /* Safety. */

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    innerConfig = *pConfig;
    ma_allocation_callbacks_init_copy(&innerConfig.allocationCallbacks, &pConfig->allocationCallbacks);

    allocationSizeInBytes = sizeof(*pAudioBuffer) - sizeof(pAudioBuffer->_pExtraData) + (pConfig->sizeInFrames * ma_get_bytes_per_frame(pConfig->format, pConfig->channels));
    if (allocationSizeInBytes > MA_SIZE_MAX) {
        return MA_OUT_OF_MEMORY;    /* Too big. */
    }

    pAudioBuffer = (ma_audio_buffer*)ma_malloc((size_t)allocationSizeInBytes, &innerConfig.allocationCallbacks);  /* Safe cast to size_t. */
    if (pAudioBuffer == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    if (pConfig->pData != NULL) {
        ma_copy_pcm_frames(&pAudioBuffer->_pExtraData[0], pConfig->pData, pConfig->sizeInFrames, pConfig->format, pConfig->channels);
    } else {
        ma_silence_pcm_frames(&pAudioBuffer->_pExtraData[0], pConfig->sizeInFrames, pConfig->format, pConfig->channels);
    }

    innerConfig.pData = &pAudioBuffer->_pExtraData[0];

    result = ma_audio_buffer_init_ex(&innerConfig, MA_FALSE, pAudioBuffer);
    if (result != MA_SUCCESS) {
        ma_free(pAudioBuffer, &innerConfig.allocationCallbacks);
        return result;
    }

    *ppAudioBuffer = pAudioBuffer;

    return MA_SUCCESS;
}